

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void ARGBShuffleRow_SSSE3(uint8_t *src_argb,uint8_t *dst_argb,uint8_t *shuffler,int width)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar2 = *(undefined1 (*) [16])shuffler;
  do {
    auVar5 = *(undefined1 (*) [16])src_argb;
    pauVar1 = (undefined1 (*) [16])((long)src_argb + 0x10);
    src_argb = (uint8_t *)((long)src_argb + 0x20);
    auVar5 = pshufb(auVar5,auVar2);
    auVar6 = pshufb(*pauVar1,auVar2);
    *(undefined1 (*) [16])dst_argb = auVar5;
    *(undefined1 (*) [16])((long)dst_argb + 0x10) = auVar6;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar4 = width + -8;
    bVar3 = 7 < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar3);
  return;
}

Assistant:

void ARGBShuffleRow_SSSE3(const uint8_t* src_argb,
                          uint8_t* dst_argb,
                          const uint8_t* shuffler,
                          int width) {
  asm volatile(

      "movdqu      (%3),%%xmm5                   \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "pshufb      %%xmm5,%%xmm0                 \n"
      "pshufb      %%xmm5,%%xmm1                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(width)      // %2
      : "r"(shuffler)    // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}